

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O0

void __thiscall
tonk::gateway::HTTPRequester::OnDone
          (HTTPRequester *this,Result *result,uint httpResponseCode,char *response,uint bytes)

{
  bool bVar1;
  basic_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_> *this_00;
  error_code *in_RDI;
  error_code ec;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined8 in_stack_ffffffffffffffc0;
  Result *in_stack_ffffffffffffffc8;
  function<void_(const_tonk::Result_&,_unsigned_int,_const_char_*,_unsigned_int)>
  *in_stack_ffffffffffffffd0;
  
  if ((in_RDI[0x1a]._M_value & 1) == 0) {
    std::function<void_(const_tonk::Result_&,_unsigned_int,_const_char_*,_unsigned_int)>::operator()
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
               (uint)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
               (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
               (uint)((ulong)in_RDI >> 0x20));
    *(undefined1 *)&in_RDI[0x1a]._M_value = 1;
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_std::default_delete<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>_>_>
                        *)0x21055d);
    if (bVar1) {
      std::error_code::error_code(in_RDI);
      this_00 = &std::
                 unique_ptr<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_std::default_delete<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>_>_>
                 ::operator->((unique_ptr<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_std::default_delete<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>_>_>
                               *)0x21057e)->
                 super_basic_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>;
      asio::basic_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>::close
                (this_00,(int)&stack0xffffffffffffffc8);
    }
  }
  return;
}

Assistant:

void HTTPRequester::OnDone(
    const Result& result,
    unsigned httpResponseCode,
    const char* response,
    unsigned bytes)
{
    if (Done) {
        return;
    }

    Callback(result, httpResponseCode, response, bytes);
    Done = true;

    // Close TCP socket so any stuck reads/writes get canceled
    if (Socket_TCP_Control) {
        asio::error_code ec;
        Socket_TCP_Control->close(ec);
    }
}